

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

void __thiscall ot::commissioner::MockSocket::MockSocket(MockSocket *this,MockSocket *aOther)

{
  MockSocket *aOther_local;
  MockSocket *this_local;
  
  Socket::Socket(&this->super_Socket,&aOther->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__MockSocket_003ed3c0;
  Address::Address(&this->mLocalAddr,&aOther->mLocalAddr);
  this->mLocalPort = aOther->mLocalPort;
  std::shared_ptr<ot::commissioner::MockSocket>::shared_ptr(&this->mPeerSocket,&aOther->mPeerSocket)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mRecvBuf);
  return;
}

Assistant:

MockSocket::MockSocket(MockSocket &&aOther)
    : Socket(std::move(aOther))
    , mLocalAddr(std::move(aOther.mLocalAddr))
    , mLocalPort(std::move(aOther.mLocalPort))
    , mPeerSocket(std::move(aOther.mPeerSocket))
{
}